

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void __thiscall
glcts::anon_unknown_0::UniformLocMixWithImplicit3::~UniformLocMixWithImplicit3
          (UniformLocMixWithImplicit3 *this)

{
  deqp::SubcaseBase::~SubcaseBase((SubcaseBase *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual long Run()
	{
		//layout (location = 0) uniform float     u0; //unused
		//layout (location = 2) uniform vec3      u1; //unused
		//layout (location = 3) uniform int       u2; //unused

		//uniform float     u3;
		//uniform vec3      u4;
		//uniform int       u5;
		std::vector<Uniform> uniforms;
		uniforms.push_back(
			Uniform(uniformValueGenerator, GL_FLOAT, Loc::C(0), DefOccurence::ALL_SH, DefOccurence::NONE_SH));
		uniforms.push_back(
			Uniform(uniformValueGenerator, GL_FLOAT_VEC3, Loc::C(2), DefOccurence::ALL_SH, DefOccurence::NONE_SH));
		uniforms.push_back(
			Uniform(uniformValueGenerator, GL_INT, Loc::C(3), DefOccurence::ALL_SH, DefOccurence::NONE_SH));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT, Loc::Implicit()));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_VEC3, Loc::Implicit()));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_INT, Loc::Implicit()));
		return doRun(uniforms);
	}